

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode cf_h2_cntrl(Curl_cfilter *cf,Curl_easy *data,int event,int arg1,void *arg2)

{
  long *plVar1;
  long lVar2;
  HTTP *pHVar3;
  uint error_code;
  char *pcVar4;
  size_t sVar5;
  uint32_t window_size;
  stream_ctx *psVar6;
  CURLcode CVar7;
  
  plVar1 = (long *)cf->ctx;
  lVar2 = plVar1[2];
  plVar1[2] = (long)data;
  CVar7 = CURLE_OK;
  switch(event + -2) {
  case 0:
  case 5:
    http2_data_done(cf,data,SUB41(event + -2,0));
    break;
  case 4:
    if ((data == (Curl_easy *)0x0) || (pHVar3 = (data->req).p.http, pHVar3 == (HTTP *)0x0)) {
      psVar6 = (stream_ctx *)0x0;
    }
    else {
      psVar6 = (stream_ctx *)pHVar3->h2_ctx;
    }
    if (((plVar1 != (long *)0x0) && ((nghttp2_session *)*plVar1 != (nghttp2_session *)0x0)) &&
       (psVar6 != (stream_ctx *)0x0)) {
      window_size = 0;
      if (arg1 == 0) {
        window_size = psVar6->local_window_size;
      }
      error_code = nghttp2_session_set_local_window_size
                             ((nghttp2_session *)*plVar1,'\0',psVar6->id,window_size);
      if (error_code == 0) {
        if (arg1 == 0) {
          drain_stream(cf,data,psVar6);
          h2_progress_egress(cf,data);
          drain_stream(cf,data,psVar6);
          Curl_expire(data,0,EXPIRE_RUN_NOW);
        }
        else {
          h2_progress_egress(cf,data);
        }
      }
      else {
        pcVar4 = nghttp2_strerror(error_code);
        Curl_failf(data,"nghttp2_session_set_local_window_size() failed: %s(%d)",pcVar4,
                   (ulong)error_code);
      }
      CVar7 = CURLE_HTTP2;
      if (error_code != 0) break;
    }
    CVar7 = CURLE_OK;
    break;
  case 6:
    CVar7 = CURLE_OK;
    if ((data == (Curl_easy *)0x0) || (pHVar3 = (data->req).p.http, pHVar3 == (HTTP *)0x0)) {
      psVar6 = (stream_ctx *)0x0;
    }
    else {
      psVar6 = (stream_ctx *)pHVar3->h2_ctx;
    }
    if (((plVar1 != (long *)0x0) && (*plVar1 != 0)) && (psVar6 != (stream_ctx *)0x0)) {
      if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
         (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"[%d] data done send",(ulong)(uint)psVar6->id);
      }
      if ((psVar6->send_closed == false) && (psVar6->send_closed = true, psVar6->upload_left != 0))
      {
        sVar5 = Curl_bufq_len(&psVar6->sendbuf);
        psVar6->upload_left = sVar5;
        nghttp2_session_resume_data((nghttp2_session *)*plVar1,psVar6->id);
        drain_stream(cf,data,psVar6);
      }
    }
  }
  *(long *)((long)cf->ctx + 0x10) = lVar2;
  return CVar7;
}

Assistant:

static CURLcode cf_h2_cntrl(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int event, int arg1, void *arg2)
{
  CURLcode result = CURLE_OK;
  struct cf_call_data save;

  (void)arg2;

  CF_DATA_SAVE(save, cf, data);
  switch(event) {
  case CF_CTRL_DATA_SETUP:
    break;
  case CF_CTRL_DATA_PAUSE:
    result = http2_data_pause(cf, data, (arg1 != 0));
    break;
  case CF_CTRL_DATA_DONE_SEND:
    result = http2_data_done_send(cf, data);
    break;
  case CF_CTRL_DATA_DETACH:
    http2_data_done(cf, data, TRUE);
    break;
  case CF_CTRL_DATA_DONE:
    http2_data_done(cf, data, arg1 != 0);
    break;
  default:
    break;
  }
  CF_DATA_RESTORE(cf, save);
  return result;
}